

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffinit(fitsfile **fptr,char *name,int *status)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  fitsfile *pfVar7;
  FITSfile *pFVar8;
  LONGLONG *pLVar9;
  long lVar10;
  char *pcVar11;
  fitsdriver *__s1;
  uint uVar12;
  ulong uVar13;
  fitsfile **ppfVar14;
  int iVar15;
  int iVar16;
  int handle;
  char urltype [20];
  char compspec [80];
  char tmplfile [1025];
  char outfile [1025];
  int local_8dc;
  fitsfile **local_8d8;
  fitsfile *local_8d0;
  uint local_8c4;
  char *local_8c0;
  char local_8b8 [32];
  char local_898 [80];
  char local_848 [1040];
  char local_438 [1032];
  
  *fptr = (fitsfile *)0x0;
  iVar4 = *status;
  if (0 < iVar4) {
    return iVar4;
  }
  if (iVar4 == -0x6a) {
    *status = 0;
  }
  uVar5 = (uint)(iVar4 == -0x6a);
  if (need_to_initialize != 0) {
    iVar3 = fits_init_cfitsio();
    *status = iVar3;
  }
  if (0 < *status) {
    return *status;
  }
  for (; cVar2 = *name, cVar2 == ' '; name = name + 1) {
  }
  if (cVar2 == '\0') {
    name = "Name of file to create is blank. (ffinit)";
LAB_0010b051:
    ffpmsg(name);
LAB_0010b056:
    *status = 0x69;
    iVar4 = 0x69;
  }
  else {
    if (iVar4 != -0x6a) {
      name = name + (cVar2 == '!');
      ffourl(name,local_8b8,local_438,local_848,local_898,status);
      ppfVar14 = fptr;
      pfVar7 = (fitsfile *)(ulong)(cVar2 == '!');
      if (*status < 1) goto LAB_0010b116;
      pcVar11 = "could not parse the output filename: (ffinit)";
LAB_0010b1ce:
      ffpmsg(pcVar11);
      ffpmsg(name);
LAB_0010b1db:
      return *status;
    }
    sVar6 = strlen(name);
    if (0x400 < sVar6) {
      name = "Filename is too long. (ffinit)";
      goto LAB_0010b051;
    }
    local_8d8 = fptr;
    local_8c4 = uVar5;
    strcpy(local_438,name);
    builtin_strncpy(local_8b8,"file://",8);
    local_848[0] = '\0';
    local_8d0 = (fitsfile *)0x0;
    local_898[0] = '\0';
    ppfVar14 = local_8d8;
    pfVar7 = local_8d0;
    uVar5 = local_8c4;
LAB_0010b116:
    local_8c4 = uVar5;
    local_8d0 = pfVar7;
    local_8d8 = ppfVar14;
    uVar13 = (ulong)(uint)no_of_drivers;
    __s1 = driverTable + uVar13;
    do {
      __s1 = __s1 + -1;
      uVar5 = (uint)uVar13;
      if ((int)uVar5 < 1) {
        iVar4 = 0x7c;
        uVar12 = uVar5;
        goto LAB_0010b166;
      }
      iVar4 = strcmp(__s1->prefix,local_8b8);
      uVar13 = (ulong)(uVar5 - 1);
    } while (iVar4 != 0);
    iVar4 = 0;
    uVar12 = uVar5 - 1;
LAB_0010b166:
    *status = iVar4;
    if ((int)uVar5 < 1) {
      pcVar11 = "could not find driver for this file: (ffinit)";
      goto LAB_0010b1ce;
    }
    if (((int)local_8d0 != 0) && (driverTable[(int)uVar12].remove != (_func_int_char_ptr *)0x0)) {
      (*driverTable[(int)uVar12].remove)(local_438);
    }
    if (driverTable[(int)uVar12].create == (_func_int_char_ptr_int_ptr *)0x0) {
      ffpmsg("cannot create a new file of this type: (ffinit)");
      goto LAB_0010b051;
    }
    iVar4 = (*driverTable[(int)uVar12].create)(local_438,&local_8dc);
    *status = iVar4;
    if (iVar4 != 0) {
      pcVar11 = "failed to create new file (already exists?):";
      goto LAB_0010b1ce;
    }
    pfVar7 = (fitsfile *)calloc(1,0x10);
    *local_8d8 = pfVar7;
    if (pfVar7 == (fitsfile *)0x0) {
      (*driverTable[(int)uVar12].close)(local_8dc);
      ffpmsg("failed to allocate structure for following file: (ffopen)");
      ffpmsg(name);
    }
    else {
      local_8d0 = pfVar7;
      pFVar8 = (FITSfile *)calloc(1,0x7e8);
      local_8d0->Fptr = pFVar8;
      if (pFVar8 == (FITSfile *)0x0) {
        (*driverTable[(int)uVar12].close)(local_8dc);
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(name);
        ppfVar14 = local_8d8;
      }
      else {
        sVar6 = strlen(name);
        uVar5 = (int)sVar6 + 1;
        sVar6 = 0x20;
        if (0x20 < (int)uVar5) {
          sVar6 = (size_t)uVar5;
        }
        local_8c0 = (char *)malloc(sVar6);
        pFVar8->filename = local_8c0;
        if (local_8c0 == (char *)0x0) {
          (*driverTable[(int)uVar12].close)(local_8dc);
          ffpmsg("failed to allocate memory for filename: (ffinit)");
          ffpmsg(name);
          ppfVar14 = local_8d8;
          free((*local_8d8)->Fptr);
          free(*ppfVar14);
          *ppfVar14 = (fitsfile *)0x0;
          goto LAB_0010b056;
        }
        pLVar9 = (LONGLONG *)calloc(0x3e9,8);
        pFVar8->headstart = pLVar9;
        if (pLVar9 == (LONGLONG *)0x0) {
          (*driverTable[(int)uVar12].close)(local_8dc);
          ffpmsg("failed to allocate memory for headstart array: (ffinit)");
          ffpmsg(name);
          ppfVar14 = local_8d8;
        }
        else {
          pcVar11 = (char *)calloc(0x28,0xb40);
          pFVar8->iobuffer = pcVar11;
          if (pcVar11 != (char *)0x0) {
            memset(pFVar8->bufrecnum,0xff,0x140);
            iVar4 = 0;
            iVar3 = 1;
            iVar15 = 2;
            iVar16 = 3;
            lVar10 = 0x1d2;
            do {
              piVar1 = &pFVar8->filehandle + lVar10;
              *piVar1 = iVar4;
              piVar1[1] = iVar3;
              piVar1[2] = iVar15;
              piVar1[3] = iVar16;
              iVar4 = iVar4 + 4;
              iVar3 = iVar3 + 4;
              iVar15 = iVar15 + 4;
              iVar16 = iVar16 + 4;
              lVar10 = lVar10 + 4;
            } while (lVar10 != 0x1fa);
            pFVar8->MAXHDU = 1000;
            pFVar8->filehandle = local_8dc;
            pFVar8->driver = uVar12;
            strcpy(local_8c0,name);
            pFVar8->filesize = 0;
            pFVar8->logfilesize = 0;
            pFVar8->writemode = 1;
            pFVar8->datastart = -1;
            pFVar8->curbuf = -1;
            pFVar8->open_count = 1;
            pFVar8->validcode = 0x22b;
            pFVar8->noextsyntax = local_8c4;
            ffldrc(local_8d0,0,1,status);
            ppfVar14 = local_8d8;
            if (*status < 1) {
              lVar10 = 0;
              do {
                if (*(long *)((long)FptrTable + lVar10) == 0) {
                  *(FITSfile **)((long)FptrTable + lVar10) = (*local_8d8)->Fptr;
                  break;
                }
                lVar10 = lVar10 + 8;
              } while (lVar10 != 80000);
            }
            if (local_848[0] != '\0') {
              ffoptplt(*local_8d8,local_848,status);
            }
            if (local_898[0] != '\0') {
              ffparsecompspec(*ppfVar14,local_898,status);
            }
            goto LAB_0010b1db;
          }
          (*driverTable[(int)uVar12].close)(local_8dc);
          ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
          ffpmsg(name);
          ppfVar14 = local_8d8;
          free((*local_8d8)->Fptr->headstart);
        }
        free((*ppfVar14)->Fptr->filename);
        free((*ppfVar14)->Fptr);
      }
      free(*ppfVar14);
      *ppfVar14 = (fitsfile *)0x0;
    }
    *status = 0x71;
    iVar4 = 0x71;
  }
  return iVar4;
}

Assistant:

int ffinit(fitsfile **fptr,      /* O - FITS file pointer                   */
           const char *name,     /* I - name of file to create              */
           int *status)          /* IO - error status                       */
/*
  Create and initialize a new FITS file.
*/
{
    int ii, driver, slen, clobber = 0;
    char *url;
    char urltype[MAX_PREFIX_LEN], outfile[FLEN_FILENAME];
    char tmplfile[FLEN_FILENAME], compspec[80];
    int handle, create_disk_file = 0;

    *fptr = 0;              /* initialize null file pointer, */
                            /* regardless of the value of *status */
    if (*status > 0)
        return(*status);

    if (*status == CREATE_DISK_FILE)
    {
       create_disk_file = 1;
       *status = 0;
    }

    if (need_to_initialize)  {          /* this is called only once */
        *status = fits_init_cfitsio();
    }

    if (*status > 0)
        return(*status);

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the filename */
        url++;

    if (*url == '\0')
    {
        ffpmsg("Name of file to create is blank. (ffinit)");
        return(*status = FILE_NOT_CREATED);
    }

    if (create_disk_file)
    {
       if (strlen(url) > FLEN_FILENAME - 1)
       {
           ffpmsg("Filename is too long. (ffinit)");
           return(*status = FILE_NOT_CREATED);
       }

       strcpy(outfile, url);
       strcpy(urltype, "file://");
       tmplfile[0] = '\0';
       compspec[0] = '\0';
    }
    else
    {
       
      /* check for clobber symbol, i.e,  overwrite existing file */
      if (*url == '!')
      {
          clobber = TRUE;
          url++;
      }
      else
          clobber = FALSE;

        /* parse the output file specification */
	/* this routine checks that the strings will not overflow */
      ffourl(url, urltype, outfile, tmplfile, compspec, status);

      if (*status > 0)
      {
        ffpmsg("could not parse the output filename: (ffinit)");
        ffpmsg(url);
        return(*status);
      }
    }
    
        /* find which driver corresponds to the urltype */
    *status = urltype2driver(urltype, &driver);

    if (*status)
    {
        ffpmsg("could not find driver for this file: (ffinit)");
        ffpmsg(url);
        return(*status);
    }

        /* delete pre-existing file, if asked to do so */
    if (clobber)
    {
        if (driverTable[driver].remove)
             (*driverTable[driver].remove)(outfile);
    }

        /* call appropriate driver to create the file */
    if (driverTable[driver].create)
    {

        FFLOCK;  /* lock this while searching for vacant handle */
        *status = (*driverTable[driver].create)(outfile, &handle);
        FFUNLOCK;

        if (*status)
        {
            ffpmsg("failed to create new file (already exists?):");
            ffpmsg(url);
            return(*status);
       }
    }
    else
    {
        ffpmsg("cannot create a new file of this type: (ffinit)");
        ffpmsg(url);
        return(*status = FILE_NOT_CREATED);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffinit)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = FILE_NOT_CREATED);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* store the file pointer */
    ((*fptr)->Fptr)->driver = driver;            /*  driver number         */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename    */
    ((*fptr)->Fptr)->filesize = 0;               /* physical file size     */
    ((*fptr)->Fptr)->logfilesize = 0;            /* logical file size      */
    ((*fptr)->Fptr)->writemode = 1;              /* read-write mode        */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data  */
    ((*fptr)->Fptr)->curbuf = -1;         /* undefined current IO buffer   */
    ((*fptr)->Fptr)->open_count = 1;      /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = create_disk_file; /* true if extended syntax is disabled */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    /* if template file was given, use it to define structure of new file */

    if (tmplfile[0])
        ffoptplt(*fptr, tmplfile, status);

    /* parse and save image compression specification, if given */
    if (compspec[0])
        ffparsecompspec(*fptr, compspec, status);

    return(*status);                       /* successful return */
}